

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O0

void __thiscall Channel::update(Channel *this)

{
  EventLoop *this_00;
  enable_shared_from_this<Channel> local_20;
  Channel *local_10;
  Channel *this_local;
  
  this_00 = this->loop_;
  local_10 = this;
  std::enable_shared_from_this<Channel>::shared_from_this(&local_20);
  EventLoop::updateChannel(this_00,(ChannelPtr *)&local_20);
  std::shared_ptr<Channel>::~shared_ptr((shared_ptr<Channel> *)&local_20);
  return;
}

Assistant:

void Channel::update() {
    loop_->updateChannel(shared_from_this());
}